

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DirectionalAdapter.cpp
# Opt level: O2

void __thiscall OpenMD::DirectionalAdapter::makeDirectional(DirectionalAdapter *this,Mat3x3d *I)

{
  AtomType *this_00;
  bool bVar1;
  DirectionalAtypeParameters directionalParam;
  undefined1 local_88 [32];
  RectMatrix<double,_3U,_3U> local_68;
  
  bVar1 = isDirectional(this);
  if (bVar1) {
    AtomType::removeProperty(this->at_,(string *)DirectionalTypeID_abi_cxx11_);
  }
  SquareMatrix<double,_3>::SquareMatrix((SquareMatrix<double,_3> *)&local_68);
  RectMatrix<double,_3U,_3U>::operator=(&local_68,(RectMatrix<double,_3U,_3U> *)I);
  this_00 = this->at_;
  std::
  make_shared<OpenMD::SimpleTypeData<OpenMD::DirectionalAtypeParameters>,std::__cxx11::string_const&,OpenMD::DirectionalAtypeParameters&>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88,
             (DirectionalAtypeParameters *)DirectionalTypeID_abi_cxx11_);
  local_88._16_8_ = local_88._0_8_;
  local_88._24_8_ = local_88._8_8_;
  local_88._0_8_ = (pointer)0x0;
  local_88._8_8_ = 0;
  AtomType::addProperty(this_00,(shared_ptr<OpenMD::GenericData> *)(local_88 + 0x10));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_88 + 0x18));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_88 + 8));
  return;
}

Assistant:

void DirectionalAdapter::makeDirectional(Mat3x3d I) {
    if (isDirectional()) { at_->removeProperty(DirectionalTypeID); }

    DirectionalAtypeParameters directionalParam {};

    directionalParam.I = I;

    at_->addProperty(std::make_shared<DirectionalAtypeData>(DirectionalTypeID,
                                                            directionalParam));
  }